

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_JUnitOutputTest_UTPRINTOutputInJUnitOutput_TestShell::createTest
          (TEST_JUnitOutputTest_UTPRINTOutputInJUnitOutput_TestShell *this)

{
  TEST_JUnitOutputTest_UTPRINTOutputInJUnitOutput_Test *this_00;
  TEST_JUnitOutputTest_UTPRINTOutputInJUnitOutput_TestShell *this_local;
  
  this_00 = (TEST_JUnitOutputTest_UTPRINTOutputInJUnitOutput_Test *)
            operator_new(0x28,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/JUnitOutputTest.cpp"
                         ,0x2e3);
  TEST_JUnitOutputTest_UTPRINTOutputInJUnitOutput_Test::
  TEST_JUnitOutputTest_UTPRINTOutputInJUnitOutput_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(JUnitOutputTest, UTPRINTOutputInJUnitOutput)
{
    testCaseRunner->start()
            .withGroup("groupname")
            .withTest("testname").thatPrints("someoutput")
            .end();

    outputFile = fileSystem.file("cpputest_groupname.xml");
    STRCMP_EQUAL("<system-out>someoutput</system-out>\n", outputFile->lineFromTheBack(3));
}